

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall gl4cts::DirectStateAccess::Framebuffers::ClearTest::Clean(ClearTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  GLuint *pGVar3;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  pGVar3 = this->m_renderbuffers;
  if (pGVar3 == (GLuint *)0x0) goto LAB_00a902a6;
  if (this->m_renderbuffers_count == 0) {
LAB_00a90288:
    operator_delete__(pGVar3);
  }
  else {
    (**(code **)(lVar2 + 0x460))();
    pGVar3 = this->m_renderbuffers;
    if (pGVar3 != (GLuint *)0x0) goto LAB_00a90288;
  }
  this->m_renderbuffers = (GLuint *)0x0;
  this->m_renderbuffers_count = 0;
LAB_00a902a6:
  do {
    iVar1 = (**(code **)(lVar2 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void ClearTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Releasing objects. */
	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	if (DE_NULL != m_renderbuffers)
	{
		if (m_renderbuffers_count)
		{
			gl.deleteRenderbuffers(m_renderbuffers_count, m_renderbuffers);
		}

		delete[] m_renderbuffers;

		m_renderbuffers		  = DE_NULL;
		m_renderbuffers_count = 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;
}